

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O1

void __thiscall Incppect<true>::Impl::run(Impl *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  _Head_base<0UL,_uWS::TemplatedApp<true>_*,_false> _Var4;
  Loop *pLVar5;
  TemplatedApp<true> *pTVar6;
  pointer __rhs;
  bool bVar7;
  unique_ptr<uWS::TemplatedApp<true>,_std::default_delete<uWS::TemplatedApp<true>_>_> app;
  _Head_base<0UL,_uWS::TemplatedApp<true>_*,_false> local_1e0;
  type local_1d8;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
  local_1c8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  string local_158;
  pointer local_138;
  pointer pcStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  type local_f8;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>_>
  local_e8;
  type local_d8;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
  local_c8;
  data_accessor local_b8 [2];
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_> local_a8
  ;
  data_accessor local_98 [2];
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_> local_88
  ;
  data_accessor local_78 [2];
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_> local_68
  ;
  type local_58;
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_48;
  
  pLVar5 = uWS::Loop::get((void *)0x0);
  this->mainLoop = pLVar5;
  printf("[incppect] running instance. serving %s from \'%s\'\n","HTTPS",
         (this->parameters).httpRoot._M_dataplus._M_p);
  local_e8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>::empty_invoker<true>
       ::invoke;
  local_e8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>_>
       ::empty_cmd;
  local_c8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
       ::empty_invoker<true>::invoke;
  local_c8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
       ::empty_cmd;
  local_a8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::empty_invoker<true>::invoke;
  local_a8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       empty_cmd;
  local_88.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::empty_invoker<true>::invoke;
  local_88.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       empty_cmd;
  local_68.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::empty_invoker<true>::invoke;
  local_68.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       empty_cmd;
  local_48.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
       ::empty_invoker<true>::invoke;
  local_48.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
       ::empty_cmd;
  local_108._0_4_ = SHARED_COMPRESSOR;
  local_108._12_4_ = 0x12d000;
  local_108._4_4_ = (this->parameters).maxPayloadLength_bytes;
  local_108._8_4_ = (this->parameters).tIdleTimeout_s;
  fu2::abi_400::detail::type_erasure::tables::
  vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>_>
  ::empty_cmd((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>_>
               *)(local_108 + 0x20),op_weak_destroy,(data_accessor *)(local_108 + 0x10),0x10,
              (data_accessor *)0x0,0);
  local_e8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:88:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:88:28)>_>,_true>
       ::invoke;
  local_e8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_uWS::HttpRequest_*)>_>
       ::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:88:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:88:28)>_>_>
       ::process_cmd<true>;
  local_f8.accessor_ = (data_accessor)this;
  (*local_c8.cmd_)((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                    *)(local_108 + 0x40),op_weak_destroy,(data_accessor *)(local_108 + 0x30),0x10,
                   (data_accessor *)0x0,0);
  local_c8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
       ::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:114:31),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:114:31)>_>,_true>
       ::invoke;
  local_c8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
       ::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:114:31),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:114:31)>_>_>
       ::process_cmd<true>;
  local_d8.accessor_ = (data_accessor)this;
  (*local_a8.cmd_)(&local_a8,op_weak_destroy,(data_accessor *)(local_108 + 0x50),0x10,
                   (data_accessor *)0x0,0);
  local_a8.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:207:29),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:207:29)>_>,_true>
       ::invoke;
  local_a8.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:207:29),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:207:29)>_>_>
       ::process_cmd<true>;
  (*local_88.cmd_)(&local_88,op_weak_destroy,local_98,0x10,(data_accessor *)0x0,0);
  local_88.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:213:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:213:28)>_>,_true>
       ::invoke;
  local_88.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:213:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:213:28)>_>_>
       ::process_cmd<true>;
  (*local_68.cmd_)(&local_68,op_weak_destroy,local_78,0x10,(data_accessor *)0x0,0);
  local_68.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*)>::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:216:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:216:28)>_>,_true>
       ::invoke;
  local_68.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:216:28),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:216:28)>_>_>
       ::process_cmd<true>;
  (*local_48.cmd_)(&local_48,op_weak_destroy,&local_58.accessor_,0x10,(data_accessor *)0x0,0);
  local_48.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
       ::
       internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:219:29),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:219:29)>_>,_true>
       ::invoke;
  local_48.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
       ::
       trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:219:29),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:219:29)>_>_>
       ::process_cmd<true>;
  local_1e0._M_head_impl = (TemplatedApp<true> *)0x0;
  pcVar1 = (this->parameters).sslKey._M_dataplus._M_p;
  pcVar2 = (this->parameters).sslCert._M_dataplus._M_p;
  local_58.accessor_ = (data_accessor)this;
  pTVar6 = (TemplatedApp<true> *)operator_new(0x20);
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_138 = pcVar1;
  pcStack_130 = pcVar2;
  uWS::TemplatedApp<true>::TemplatedApp
            (pTVar6,(us_socket_context_options_t)ZEXT1648(CONCAT88(pcVar2,pcVar1)));
  _Var4._M_head_impl = local_1e0._M_head_impl;
  bVar7 = local_1e0._M_head_impl != (TemplatedApp<true> *)0x0;
  local_1e0._M_head_impl = pTVar6;
  if (bVar7) {
    uWS::TemplatedApp<true>::~TemplatedApp(_Var4._M_head_impl);
    operator_delete(_Var4._M_head_impl,0x20);
  }
  _Var4._M_head_impl = local_1e0._M_head_impl;
  if ((local_1e0._M_head_impl)->httpContext == (HttpContext<true> *)0x0) {
    puts("[incppect] failed to construct uWS server!");
    puts("[incppect] verify that you have valid certificate files:");
    printf("[incppect] key  file : \'%s\'\n",(this->parameters).sslKey._M_dataplus._M_p);
    printf("[incppect] cert file : \'%s\'\n",(this->parameters).sslCert._M_dataplus._M_p);
  }
  else {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/incppect","");
    pTVar6 = uWS::TemplatedApp<true>::ws<Incppect<true>::Impl::PerSocketData>
                       (_Var4._M_head_impl,&local_158,(WebSocketBehavior *)local_108);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/incppect.js","");
    local_1c8.vtable_ =
         fu2::abi_400::detail::type_erasure::invocation_table::
         function_trait<void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>::
         internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:256:31),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:256:31)>_>,_true>
         ::invoke;
    local_1c8.cmd_ =
         fu2::abi_400::detail::type_erasure::tables::
         vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
         ::
         trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:256:31),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:256:31)>_>_>
         ::process_cmd<true>;
    uWS::TemplatedApp<true>::get
              (pTVar6,&local_178,
               (unique_function<void_(HttpResponse<true>_*,_HttpRequest_*)> *)&local_1d8);
    (*local_1c8.cmd_)(&local_1c8,op_weak_destroy,&local_1d8.accessor_,0x10,(data_accessor *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    __rhs = (this->parameters).resources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->parameters).resources.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs != pbVar3) {
      do {
        _Var4._M_head_impl = local_1e0._M_head_impl;
        std::operator+(&local_198,"/",__rhs);
        local_1c8.vtable_ =
             fu2::abi_400::detail::type_erasure::invocation_table::
             function_trait<void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>::
             internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:260:40),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:260:40)>_>,_true>
             ::invoke;
        local_1c8.cmd_ =
             fu2::abi_400::detail::type_erasure::tables::
             vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
             ::
             trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:260:40),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:260:40)>_>_>
             ::process_cmd<true>;
        local_1d8.accessor_ = (data_accessor)this;
        uWS::TemplatedApp<true>::get
                  (_Var4._M_head_impl,&local_198,
                   (unique_function<void_(HttpResponse<true>_*,_HttpRequest_*)> *)&local_1d8);
        (*local_1c8.cmd_)(&local_1c8,op_weak_destroy,&local_1d8.accessor_,0x10,(data_accessor *)0x0,
                          0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
      } while (__rhs != pbVar3);
    }
    _Var4._M_head_impl = local_1e0._M_head_impl;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/*","");
    local_1c8.vtable_ =
         fu2::abi_400::detail::type_erasure::invocation_table::
         function_trait<void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>::
         internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:301:26),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:301:26)>_>,_true>
         ::invoke;
    local_1c8.cmd_ =
         fu2::abi_400::detail::type_erasure::tables::
         vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
         ::
         trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:301:26),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:301:26)>_>_>
         ::process_cmd<true>;
    local_1d8.accessor_ = (data_accessor)this;
    uWS::TemplatedApp<true>::get
              (_Var4._M_head_impl,&local_1b8,
               (unique_function<void_(HttpResponse<true>_*,_HttpRequest_*)> *)&local_1d8);
    (*local_1c8.cmd_)(&local_1c8,op_weak_destroy,&local_1d8.accessor_,0x10,(data_accessor *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_1c8.vtable_ =
         fu2::abi_400::detail::type_erasure::invocation_table::
         function_trait<void_(us_listen_socket_t_*)>::
         internal_invoker<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:308:46),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:308:46)>_>,_true>
         ::invoke;
    local_1c8.cmd_ =
         fu2::abi_400::detail::type_erasure::tables::
         vtable<fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>::
         trait<fu2::abi_400::detail::type_erasure::box<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:308:46),_std::allocator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/src/incppect.cpp:308:46)>_>_>
         ::process_cmd<true>;
    local_1d8.accessor_ = (data_accessor)this;
    uWS::TemplatedApp<true>::listen
              (local_1e0._M_head_impl,(this->parameters).portListen,(int)&local_1d8);
    pLVar5 = uWS::Loop::get((void *)0x0);
    us_loop_run(pLVar5);
    (*local_1c8.cmd_)(&local_1c8,op_weak_destroy,&local_1d8.accessor_,0x10,(data_accessor *)0x0,0);
  }
  std::unique_ptr<uWS::TemplatedApp<true>,_std::default_delete<uWS::TemplatedApp<true>_>_>::
  ~unique_ptr((unique_ptr<uWS::TemplatedApp<true>,_std::default_delete<uWS::TemplatedApp<true>_>_> *
              )&local_1e0);
  uWS::TemplatedApp<true>::WebSocketBehavior::~WebSocketBehavior((WebSocketBehavior *)local_108);
  return;
}

Assistant:

void run() {
        mainLoop = uWS::Loop::get();

        {
            const char * kProtocol = SSL ? "HTTPS" : "HTTP";
            my_printf("[incppect] running instance. serving %s from '%s'\n", kProtocol, parameters.httpRoot.c_str());
        }

        typename uWS::TemplatedApp<SSL>::WebSocketBehavior wsBehaviour;
        wsBehaviour.compression = uWS::SHARED_COMPRESSOR;
        wsBehaviour.maxPayloadLength = parameters.maxPayloadLength_bytes;
        wsBehaviour.idleTimeout = parameters.tIdleTimeout_s;
        wsBehaviour.open = [&](auto * ws, auto * /*req*/) {
            static int32_t uniqueId = 1;
            ++uniqueId;

            auto & cd = clientData[uniqueId];
            cd.tConnected_ms = ::timestamp();

            auto addressBytes = ws->getRemoteAddress();
            cd.ipAddress[0] = addressBytes[12];
            cd.ipAddress[1] = addressBytes[13];
            cd.ipAddress[2] = addressBytes[14];
            cd.ipAddress[3] = addressBytes[15];

            auto sd = (PerSocketData *) ws->getUserData();
            sd->clientId = uniqueId;
            sd->ws = ws;
            sd->mainLoop = uWS::Loop::get();

            socketData.insert({ uniqueId, sd });

            my_printf("[incppect] client with id = %d connected\n", sd->clientId);

            if (handler) {
                handler(sd->clientId, Connect, { (const char *) cd.ipAddress, 4 } );
            }
        };
        wsBehaviour.message = [this](auto * ws, std::string_view message, uWS::OpCode /*opCode*/) {
            rxTotal_bytes += message.size();
            if (message.size() < sizeof(int)) {
                return;
            }

            int32_t type = -1;
            std::memcpy((char *)(&type), message.data(), sizeof(type));

            bool doUpdate = true;

            auto sd = (PerSocketData *) ws->getUserData();
            auto & cd = clientData[sd->clientId];

            switch (type) {
                case 1:
                    {
                        std::stringstream ss(message.data() + 4);
                        while (true) {
                            Request request;

                            std::string path;
                            ss >> path;
                            if (ss.eof()) break;
                            int requestId = 0;
                            ss >> requestId;
                            int nidxs = 0;
                            ss >> nidxs;
                            for (int i = 0; i < nidxs; ++i) {
                                int idx = 0;
                                ss >> idx;
                                if (idx == -1) idx = sd->clientId;
                                request.idxs.push_back(idx);
                            }

                            if (pathToGetter.find(path) != pathToGetter.end()) {
                                my_printf("[incppect] requestId = %d, path = '%s', nidxs = %d\n", requestId, path.c_str(), nidxs);
                                request.getterId = pathToGetter[path];

                                cd.requests[requestId] = std::move(request);
                            } else {
                                my_printf("[incppect] missing path '%s'\n", path.c_str());
                            }
                        }
                    }
                    break;
                case 2:
                    {
                        int nRequests = (message.size() - sizeof(int32_t))/sizeof(int32_t);
                        if (nRequests*sizeof(int32_t) + sizeof(int32_t) != message.size()) {
                            my_printf("[incppect] error : invalid message data!\n");
                            return;
                        }
                        my_printf("[incppect] received requests: %d\n", nRequests);

                        cd.lastRequests.clear();
                        for (int i = 0; i < nRequests; ++i) {
                            int32_t curRequest = -1;
                            std::memcpy((char *)(&curRequest), message.data() + 4*(i + 1), sizeof(curRequest));
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.lastRequests.push_back(curRequest);
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 3:
                    {
                        for (auto curRequest : cd.lastRequests) {
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 4:
                    {
                        doUpdate = false;
                        if (handler && message.size() > sizeof(int32_t)) {
                            handler(sd->clientId, Custom, { message.data() + sizeof(int32_t), message.size() - sizeof(int32_t) } );
                        }
                    }
                    break;
                default:
                    my_printf("[incppect] unknown message type: %d\n", type);
            };

            if (doUpdate) {
                sd->mainLoop->defer([this]() { this->update(); });
            }
        };
        wsBehaviour.drain = [](auto *ws) {
            /* Check getBufferedAmount here */
            if (ws->getBufferedAmount() > 0) {
                my_printf("[incppect] drain: buffered amount = %d\n", ws->getBufferedAmount());
            }
        };
        wsBehaviour.ping = [](auto * /*ws*/) {

        };
        wsBehaviour.pong = [](auto * /*ws*/) {

        };
        wsBehaviour.close = [this](auto * ws, int /*code*/, std::string_view /*message*/) {
            auto sd = (PerSocketData *) ws->getUserData();
            my_printf("[incppect] client with id = %d disconnected\n", sd->clientId);

            clientData.erase(sd->clientId);
            socketData.erase(sd->clientId);

            if (handler) {
                handler(sd->clientId, Disconnect, { nullptr, 0 } );
            }
        };

        std::unique_ptr<uWS::TemplatedApp<SSL>> app;

        if constexpr (SSL) {
            us_socket_context_options_t ssl_options = {};

            ssl_options.key_file_name = parameters.sslKey.data();
            ssl_options.cert_file_name = parameters.sslCert.data();

            app.reset(new uWS::TemplatedApp<SSL>(ssl_options));
        } else {
            app.reset(new uWS::TemplatedApp<SSL>());
        }

        if (app->constructorFailed()) {
            my_printf("[incppect] failed to construct uWS server!\n");
            if (SSL) {
                my_printf("[incppect] verify that you have valid certificate files:\n");
                my_printf("[incppect] key  file : '%s'\n", parameters.sslKey.c_str());
                my_printf("[incppect] cert file : '%s'\n", parameters.sslCert.c_str());
            }

            return;
        }

        (*app).template ws<PerSocketData>("/incppect", std::move(wsBehaviour)
        ).get("/incppect.js", [](auto *res, auto * /*req*/) {
                res->end(kIncppect_js);
        });
        for (const auto & resource : parameters.resources) {
            (*app).get("/" + resource, [this](auto *res, auto *req) {
                std::string url = std::string(req->getUrl());
                my_printf("url = '%s'\n", url.c_str());

                if (url.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (url[url.size() - 1] == '/') {
                    url += "index.html";
                }

                if (resources.find(url) != resources.end()) {
                    res->end(resources[url]);
                    return;
                }

                my_printf("resource = '%s'\n", (parameters.httpRoot + url).c_str());
                std::ifstream fin(parameters.httpRoot + url);

                if (fin.is_open() == false || fin.good() == false) {
                    res->end("Resource not found");
                    return;
                }

                const std::string str((std::istreambuf_iterator<char>(fin)),
                                      std::istreambuf_iterator<char>());

                if (str.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (hasExt(req->getUrl(), ".js")) {
                    res->writeHeader("Content-Type", "text/javascript");
                }

                res->end(str);
            });
        }
        (*app).get("/*", [this](auto *res, auto *req) {
            const std::string url = std::string(req->getUrl());
            my_printf("url = '%s'\n", url.c_str());

            res->end("Resource not found");
            return;
        });
        (*app).listen(parameters.portListen, [this](auto *token) {
            this->listenSocket = token;
            if (token) {
                my_printf("[incppect] listening on port %d\n", parameters.portListen);

                const char * kProtocol = SSL ? "https" : "http";
                my_printf("[incppect] %s://localhost:%d/\n", kProtocol, parameters.portListen);
            }
        }).run();
    }